

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

void __thiscall player_t::DestroyPSprites(player_t *this)

{
  DPSprite *pDVar1;
  DPSprite *pDVar2;
  
  pDVar2 = (this->psprites).field_0.p;
  if ((pDVar2 == (DPSprite *)0x0) || (((pDVar2->super_DObject).ObjectFlags & 0x20) != 0)) {
    (this->psprites).field_0.p = (DPSprite *)0x0;
  }
  else {
    (this->psprites).field_0.p = (DPSprite *)0x0;
    do {
      pDVar1 = (pDVar2->Next).field_0.p;
      if ((pDVar1 == (DPSprite *)0x0) || (((pDVar1->super_DObject).ObjectFlags & 0x20) != 0)) {
        pDVar1 = (DPSprite *)0x0;
      }
      (pDVar2->Next).field_0.p = (DPSprite *)0x0;
      (*(pDVar2->super_DObject)._vptr_DObject[4])();
      pDVar2 = pDVar1;
    } while (pDVar1 != (DPSprite *)0x0);
  }
  return;
}

Assistant:

void player_t::DestroyPSprites()
{
	DPSprite *pspr = psprites;
	psprites = nullptr;
	while (pspr)
	{
		DPSprite *next = pspr->Next;
		pspr->Next = nullptr;
		pspr->Destroy();
		pspr = next;
	}
}